

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

FunctionValue *
GetFunctionForType(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ExprBase *value,TypeFunction *type)

{
  ModuleData *pMVar1;
  TypeFunction *pTVar2;
  FunctionData *pFVar3;
  Allocator *pAVar4;
  undefined1 auVar5 [16];
  ArrayView<ArgumentData> arguments_00;
  bool bVar6;
  int iVar7;
  TypeBase *pTVar8;
  TypeBase *pTVar9;
  TypeHandle *node;
  TypeHandle *pTVar10;
  SynBase **ppSVar11;
  long lVar12;
  uint uVar13;
  TypeHandle *pTVar14;
  int iVar15;
  SynBase *pSVar16;
  ExpressionContext *this;
  FunctionData *pFVar17;
  ulong uVar18;
  IntrusiveList<TypeHandle> arguments_01;
  FunctionValue bestGenericMatch;
  IntrusiveList<TypeHandle> arguments;
  FunctionValue bestMatch;
  SmallArray<FunctionValue,_32U> functions;
  IntrusiveList<MatchData> aliases;
  TypeFunction *local_a00;
  TypeFunction *local_9e8;
  SynBase *local_9c8;
  char *pcStack_9c0;
  undefined8 local_9b8;
  undefined1 local_9a8 [40];
  char *pcStack_980;
  ModuleData *local_978;
  ModuleData *local_970;
  uint uStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [8];
  ModuleData *local_958;
  ModuleData local_950 [10];
  undefined8 uStack_658;
  ModuleData *local_650;
  undefined1 local_648 [24];
  undefined8 auStack_630 [191];
  Allocator *local_38;
  undefined4 extraout_var;
  
  pMVar1 = (ModuleData *)ctx->allocator;
  pFVar17 = (FunctionData *)type;
  memset(local_950,0,0x300);
  local_958 = (ModuleData *)0x2000000000;
  this = ctx;
  local_960 = (undefined1  [8])local_950;
  local_650 = pMVar1;
  GetNodeFunctions(ctx,source,value,(SmallArray<FunctionValue,_32U> *)(local_9a8 + 0x48));
  if ((int)local_958 != 0) {
    local_9a8._32_8_ = (SynBase *)0x0;
    pcStack_980 = (char *)0x0;
    local_9e8 = (TypeFunction *)0x0;
    local_978 = (ModuleData *)0x0;
    local_9b8 = 0;
    local_9c8 = (SynBase *)0x0;
    pcStack_9c0 = (char *)0x0;
    uVar13 = 2;
    if ((int)local_958 == 0) {
      local_a00 = (TypeFunction *)0x0;
    }
    else {
      uVar18 = 0;
      local_a00 = (TypeFunction *)0x0;
      local_9e8 = (TypeFunction *)0x0;
      do {
        pTVar10 = (type->arguments).head;
        iVar7 = 0;
        if (pTVar10 != (TypeHandle *)0x0) {
          iVar7 = 0;
          do {
            iVar7 = iVar7 + 1;
            pTVar10 = pTVar10->next;
          } while (pTVar10 != (TypeHandle *)0x0);
        }
        this = (ExpressionContext *)(uVar18 * 3);
        pTVar2 = *(TypeFunction **)(*(long *)((long)((long)local_960 + 8) + uVar18 * 0x18) + 0x28);
        iVar15 = 0;
        for (pTVar10 = (pTVar2->arguments).head; pTVar10 != (TypeHandle *)0x0;
            pTVar10 = pTVar10->next) {
          iVar15 = iVar15 + 1;
        }
        uVar13 = 4;
        if (iVar7 == iVar15) {
          if ((type->super_TypeBase).isGeneric == true) {
            local_648._0_8_ = (ModuleData *)0x0;
            local_648._8_8_ = (ModuleData *)0x0;
            pFVar17 = (FunctionData *)local_648;
            this = ctx;
            pTVar8 = MatchGenericType(ctx,source,type->returnType,pTVar2->returnType,
                                      (IntrusiveList<MatchData> *)pFVar17,true);
            local_9a8._0_8_ = (SynBase *)0x0;
            local_9a8._8_8_ = (FunctionData *)0x0;
            pTVar10 = (type->arguments).head;
            if (pTVar10 != (TypeHandle *)0x0) {
              for (pTVar14 = (pTVar2->arguments).head; pTVar14 != (TypeHandle *)0x0;
                  pTVar14 = pTVar14->next) {
                pFVar17 = (FunctionData *)local_648;
                this = ctx;
                pTVar9 = MatchGenericType(ctx,source,pTVar10->type,pTVar14->type,
                                          (IntrusiveList<MatchData> *)pFVar17,true);
                if ((pTVar9 != (TypeBase *)0x0) && (pTVar9->isGeneric == false)) {
                  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                  node = (TypeHandle *)CONCAT44(extraout_var,iVar7);
                  node->type = pTVar9;
                  node->next = (TypeHandle *)0x0;
                  node->listed = false;
                  this = (ExpressionContext *)local_9a8;
                  IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)this,node);
                }
                pTVar10 = pTVar10->next;
                if (pTVar10 == (TypeHandle *)0x0) break;
              }
            }
            bVar6 = true;
            if (pTVar8 != (TypeBase *)0x0) {
              iVar7 = 0;
              iVar15 = 0;
              if ((SynBase *)local_9a8._0_8_ != (SynBase *)0x0) {
                iVar15 = 0;
                pSVar16 = (SynBase *)local_9a8._0_8_;
                do {
                  iVar15 = iVar15 + 1;
                  pSVar16 = *(SynBase **)&pSVar16->typeID;
                } while (pSVar16 != (SynBase *)0x0);
              }
              pTVar10 = (type->arguments).head;
              if (pTVar10 != (TypeHandle *)0x0) {
                iVar7 = 0;
                do {
                  iVar7 = iVar7 + 1;
                  pTVar10 = pTVar10->next;
                } while (pTVar10 != (TypeHandle *)0x0);
              }
              if (iVar15 == iVar7) {
                if (pcStack_9c0 == (char *)0x0) {
                  if (((ulong)local_958 & 0xffffffff) <= uVar18) {
LAB_001604ba:
                    __assert_fail("index < count",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                  ,0x199,
                                  "T &SmallArray<FunctionValue, 32>::operator[](unsigned int) [T = FunctionValue, N = 32]"
                                 );
                  }
                  local_9c8 = ((SynBase **)local_960)[uVar18 * 3];
                  pcStack_9c0 = ((InplaceStr *)((SynBase **)local_960 + uVar18 * 3 + 1))->begin;
                  local_9b8 = *(undefined8 *)((long)((long)local_960 + 8) + uVar18 * 0x18 + 8);
                  arguments_01.tail = (TypeHandle *)local_9a8._8_8_;
                  arguments_01.head = (TypeHandle *)local_9a8._0_8_;
                  this = ctx;
                  pFVar17 = (FunctionData *)local_9a8._8_8_;
                  local_9e8 = ExpressionContext::GetFunctionType(ctx,source,pTVar8,arguments_01);
                }
                else {
                  __return_storage_ptr__->source = (SynBase *)0x0;
                  __return_storage_ptr__->function = (FunctionData *)0x0;
                  __return_storage_ptr__->context = (ExprBase *)0x0;
                  bVar6 = false;
                }
              }
            }
joined_r0x001601e3:
            uVar13 = 1;
            if (!bVar6) goto LAB_00160209;
          }
          else {
            if ((pTVar2->super_TypeBase).isGeneric == true) {
              local_648._0_8_ = (ModuleData *)0x0;
              local_648._8_8_ = (ModuleData *)0x0;
              pTVar10 = (type->arguments).head;
              pTVar14 = (pTVar2->arguments).head;
              iVar7 = 0;
              if (pTVar10 != (TypeHandle *)0x0 && pTVar14 != (TypeHandle *)0x0) {
                iVar7 = 0;
                do {
                  pFVar17 = (FunctionData *)local_648;
                  this = ctx;
                  pTVar8 = MatchGenericType(ctx,source,pTVar14->type,pTVar10->type,
                                            (IntrusiveList<MatchData> *)pFVar17,true);
                  if (pTVar8 != (TypeBase *)0x0) {
                    iVar7 = iVar7 + (pTVar8->isGeneric ^ 1);
                  }
                  pTVar14 = pTVar14->next;
                } while ((pTVar14 != (TypeHandle *)0x0) &&
                        (pTVar10 = pTVar10->next, pTVar10 != (TypeHandle *)0x0));
              }
              if ((pTVar2->returnType == ctx->typeAuto) || (pTVar2->returnType == type->returnType))
              {
                iVar7 = iVar7 + 1;
              }
              iVar15 = 1;
              for (pTVar10 = (type->arguments).head; pTVar10 != (TypeHandle *)0x0;
                  pTVar10 = pTVar10->next) {
                iVar15 = iVar15 + 1;
              }
              bVar6 = true;
              if (iVar7 == iVar15) {
                if (pcStack_9c0 == (char *)0x0) {
                  if (((ulong)local_958 & 0xffffffff) <= uVar18) goto LAB_001604ba;
                  local_9c8 = ((SynBase **)local_960)[uVar18 * 3];
                  pcStack_9c0 = ((InplaceStr *)((SynBase **)local_960 + uVar18 * 3 + 1))->begin;
                  local_9b8 = *(undefined8 *)((long)((long)local_960 + 8) + uVar18 * 0x18 + 8);
                  local_9e8 = type;
                }
                else {
                  __return_storage_ptr__->source = (SynBase *)0x0;
                  __return_storage_ptr__->function = (FunctionData *)0x0;
                  __return_storage_ptr__->context = (ExprBase *)0x0;
                  bVar6 = false;
                }
              }
              goto joined_r0x001601e3;
            }
            if (pTVar2 == type) {
              if (pcStack_980 != (char *)0x0) {
                __return_storage_ptr__->source = (SynBase *)0x0;
                __return_storage_ptr__->function = (FunctionData *)0x0;
                __return_storage_ptr__->context = (ExprBase *)0x0;
                uVar13 = 1;
                goto LAB_00160209;
              }
              ppSVar11 = (SynBase **)local_960 + uVar18 * 3;
              local_978 = (ModuleData *)ppSVar11[2];
              local_9a8._32_8_ = *ppSVar11;
              pcStack_980 = ((InplaceStr *)(ppSVar11 + 1))->begin;
              local_a00 = type;
            }
          }
          uVar13 = 0;
        }
LAB_00160209:
        if ((uVar13 & 3) != 0) goto LAB_00160242;
        uVar18 = uVar18 + 1;
      } while (uVar18 < ((ulong)local_958 & 0xffffffff));
      uVar13 = 2;
    }
LAB_00160242:
    if (uVar13 == 2) {
      ppSVar11 = &local_9c8;
      if (pcStack_980 != (char *)0x0) {
        ppSVar11 = (SynBase **)(local_9a8 + 0x20);
      }
      pFVar3 = (FunctionData *)ppSVar11[1];
      __return_storage_ptr__->source = *ppSVar11;
      __return_storage_ptr__->function = pFVar3;
      if (pcStack_980 == (char *)0x0) {
        local_a00 = local_9e8;
      }
      __return_storage_ptr__->context = (ExprBase *)ppSVar11[2];
      pFVar3 = __return_storage_ptr__->function;
      uVar13 = 0;
      if (pFVar3 != (FunctionData *)0x0) {
        pAVar4 = ctx->allocator;
        lVar12 = 0x20;
        do {
          *(undefined8 *)((long)&uStack_658 + lVar12) = 0;
          *(undefined1 *)((long)&local_650 + lVar12) = 0;
          *(undefined8 *)(local_648 + lVar12) = 0;
          *(undefined8 *)(local_648 + lVar12 + 8) = 0;
          *(undefined8 *)(local_648 + lVar12 + 0x10) = 0;
          *(undefined8 *)((long)auStack_630 + lVar12) = 0;
          lVar12 = lVar12 + 0x30;
        } while (lVar12 != 0x620);
        local_648._0_8_ = local_648 + 0x10;
        local_648._8_8_ = (ModuleData *)0x2000000000;
        pTVar10 = (local_a00->arguments).head;
        local_38 = pAVar4;
        if (pTVar10 != (TypeHandle *)0x0) {
          do {
            pTVar8 = pTVar10->type;
            if (local_648._8_4_ == local_648._12_4_) {
              this = (ExpressionContext *)local_648;
              SmallArray<ArgumentData,_32U>::grow
                        ((SmallArray<ArgumentData,_32U> *)local_648,local_648._8_4_);
            }
            if ((ModuleData *)local_648._0_8_ == (ModuleData *)0x0) {
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,
                            "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]"
                           );
            }
            uVar18 = local_648._8_8_ & 0xffffffff;
            local_648._8_4_ = local_648._8_4_ + 1;
            ((SynBase **)local_648._0_8_)[uVar18 * 6] = source;
            *(bool *)&((InplaceStr *)(local_648._0_8_ + 8))[uVar18 * 3].begin = false;
            ((InplaceStr *)(local_648._0_8_ + 8))[uVar18 * 3].end = (char *)0x0;
            ((TypeBase **)(local_648._0_8_ + 0x18))[uVar18 * 6] = pTVar8;
            ((InplaceStr *)(local_648._0_8_ + 0x20))[uVar18 * 3].begin = (char *)0x0;
            ((InplaceStr *)(local_648._0_8_ + 0x20))[uVar18 * 3].end = (char *)0x0;
            pTVar10 = pTVar10->next;
          } while (pTVar10 != (TypeHandle *)0x0);
        }
        bVar6 = ExpressionContext::IsGenericFunction(this,pFVar3);
        if (bVar6) {
          local_970 = (ModuleData *)local_648._0_8_;
          uStack_968 = local_648._8_4_;
          arguments_00._12_4_ = uStack_964;
          arguments_00.count = local_648._8_4_;
          arguments_00.data = (ArgumentData *)local_648._0_8_;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pFVar17;
          CreateGenericFunctionInstance
                    ((FunctionValue *)local_9a8,ctx,source,*__return_storage_ptr__,
                     (IntrusiveList<TypeHandle>)(auVar5 << 0x40),arguments_00,false);
          __return_storage_ptr__->context = (ExprBase *)local_9a8._16_8_;
          __return_storage_ptr__->source = (SynBase *)local_9a8._0_8_;
          __return_storage_ptr__->function = (FunctionData *)local_9a8._8_8_;
        }
        pFVar17 = __return_storage_ptr__->function;
        if (pFVar17 != (FunctionData *)0x0) {
          if (local_a00->returnType == ctx->typeAuto) {
            local_a00 = ExpressionContext::GetFunctionType
                                  (ctx,source,pFVar17->type->returnType,local_a00->arguments);
          }
          if (pFVar17->type == local_a00) {
            SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_648);
            uVar13 = 1;
            goto LAB_00160465;
          }
        }
        SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_648);
        uVar13 = 0;
      }
    }
LAB_00160465:
    if (uVar13 != 0) goto LAB_00160479;
  }
  __return_storage_ptr__->source = (SynBase *)0x0;
  __return_storage_ptr__->function = (FunctionData *)0x0;
  __return_storage_ptr__->context = (ExprBase *)0x0;
LAB_00160479:
  SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)(local_9a8 + 0x48));
  return __return_storage_ptr__;
}

Assistant:

FunctionValue GetFunctionForType(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeFunction *type)
{
	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);

	GetNodeFunctions(ctx, source, value, functions);

	if(!functions.empty())
	{
		FunctionValue bestMatch;
		TypeFunction *bestMatchTarget = NULL;

		FunctionValue bestGenericMatch;
		TypeFunction *bestGenericMatchTarget = NULL;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			TypeFunction *functionType = functions[i].function->type;

			if(type->arguments.size() != functionType->arguments.size())
				continue;

			if(type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				TypeBase *returnType = MatchGenericType(ctx, source, type->returnType, functionType->returnType, aliases, true);
				IntrusiveList<TypeHandle> arguments;

				for(TypeHandle *lhs = type->arguments.head, *rhs = functionType->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(match));
				}

				if(returnType && arguments.size() == type->arguments.size())
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = ctx.GetFunctionType(source, returnType, arguments);
				}
			}
			else if(functionType->isGeneric)
			{
				unsigned matches = 0;

				IntrusiveList<MatchData> aliases;

				for(TypeHandle *lhs = functionType->arguments.head, *rhs = type->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						matches++;
				}

				if(functionType->returnType == ctx.typeAuto || functionType->returnType == type->returnType)
					matches++;

				if(matches == type->arguments.size() + 1)
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = type;
				}
			}
			else if(functionType == type)
			{
				if(bestMatch)
					return FunctionValue();

				bestMatch = functions[i];
				bestMatchTarget = type;
			}
		}

		FunctionValue bestOverload = bestMatch ? bestMatch : bestGenericMatch;
		TypeFunction *bestTarget = bestMatch ? bestMatchTarget : bestGenericMatchTarget;

		if(bestOverload)
		{
			SmallArray<ArgumentData, 32> arguments(ctx.allocator);

			for(TypeHandle *curr = bestTarget->arguments.head; curr; curr = curr->next)
				arguments.push_back(ArgumentData(source, false, NULL, curr->type, NULL));

			FunctionData *function = bestOverload.function;

			if(ctx.IsGenericFunction(function))
				bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, IntrusiveList<TypeHandle>(), arguments, false);

			if(bestOverload)
			{
				if(bestTarget->returnType == ctx.typeAuto)
					bestTarget = ctx.GetFunctionType(source, bestOverload.function->type->returnType, bestTarget->arguments);

				if(bestOverload.function->type == bestTarget)
					return bestOverload;
			}
		}
	}

	return FunctionValue();
}